

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall myvk::Buffer::~Buffer(Buffer *this)

{
  _Atomic_word *p_Var1;
  VkBuffer buffer;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_BufferBase).super_DeviceObjectBase.super_Base._vptr_Base =
       (_func_int **)&PTR__Buffer_0032f1e8;
  buffer = (this->super_BufferBase).m_buffer;
  if (buffer != (VkBuffer)0x0) {
    vmaDestroyBuffer(((this->m_device_ptr).
                      super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     m_allocator,buffer,this->m_allocation);
  }
  p_Var2 = (this->m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->super_BufferBase).super_DeviceObjectBase.super_Base.
           super_enable_shared_from_this<myvk::Base>._M_weak_this.
           super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

Buffer::~Buffer() {
	if (m_buffer)
		vmaDestroyBuffer(m_device_ptr->GetAllocatorHandle(), m_buffer, m_allocation);
}